

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disk.cpp
# Opt level: O1

ssize_t __thiscall Disk::write(Disk *this,int __fd,void *__buf,size_t __n)

{
  mutex *__mutex;
  TrackDataType TVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  mapped_type *pmVar5;
  undefined8 uVar6;
  undefined4 in_register_00000034;
  key_type *pkVar7;
  CylHead cylhead;
  key_type local_28;
  
  pkVar7 = (key_type *)CONCAT44(in_register_00000034,__fd);
  (this->fmt).sectors = 0;
  __mutex = &this->m_trackdata_mutex;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar4 == 0) {
    local_28 = *pkVar7;
    pmVar5 = std::
             map<CylHead,_TrackData,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_TrackData>_>_>
             ::operator[](&this->m_trackdata,&local_28);
    iVar4 = pkVar7->head;
    TVar1 = pkVar7[1].cyl;
    iVar2 = pkVar7[1].head;
    (pmVar5->cylhead).cyl = pkVar7->cyl;
    (pmVar5->cylhead).head = iVar4;
    pmVar5->m_type = TVar1;
    pmVar5->m_flags = iVar2;
    iVar4 = pkVar7[2].head;
    (pmVar5->m_track).tracklen = pkVar7[2].cyl;
    (pmVar5->m_track).tracktime = iVar4;
    std::vector<Sector,_std::allocator<Sector>_>::_M_move_assign
              (&(pmVar5->m_track).m_sectors,pkVar7 + 3);
    iVar4 = pkVar7[6].head;
    (pmVar5->m_bitstream).datarate = pkVar7[6].cyl;
    (pmVar5->m_bitstream).encoding = iVar4;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&(pmVar5->m_bitstream).m_data,pkVar7 + 7);
    std::vector<int,_std::allocator<int>_>::_M_move_assign
              (&(pmVar5->m_bitstream).m_indexes,pkVar7 + 10);
    std::vector<int,_std::allocator<int>_>::_M_move_assign
              (&(pmVar5->m_bitstream).m_sync_losses,pkVar7 + 0xd);
    (pmVar5->m_bitstream).m_wrapped = SUB41(pkVar7[0x12].cyl,0);
    iVar4 = pkVar7[0x10].head;
    iVar2 = pkVar7[0x11].cyl;
    iVar3 = pkVar7[0x11].head;
    (pmVar5->m_bitstream).m_bitsize = pkVar7[0x10].cyl;
    (pmVar5->m_bitstream).m_bitpos = iVar4;
    (pmVar5->m_bitstream).m_splicepos = iVar2;
    (pmVar5->m_bitstream).m_next_index = iVar3;
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::_M_move_assign(&pmVar5->m_flux,pkVar7 + 0x13);
    pmVar5->m_normalised_flux = SUB41(pkVar7[0x16].cyl,0);
    pmVar5 = std::
             map<CylHead,_TrackData,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_TrackData>_>_>
             ::operator[](&this->m_trackdata,&local_28);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return (ssize_t)pmVar5;
  }
  uVar6 = std::__throw_system_error(iVar4);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar6);
}

Assistant:

const TrackData& Disk::write(TrackData&& trackdata)
{
    // Invalidate stored format, since we can no longer guarantee a match
    fmt.sectors = 0;

    std::lock_guard<std::mutex> lock(m_trackdata_mutex);
    auto cylhead = trackdata.cylhead;
    m_trackdata[cylhead] = std::move(trackdata);
    return m_trackdata[cylhead];
}